

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_block_statemach(connectdata *conn)

{
  CURLcode local_24;
  CURLcode result;
  pingpong *pp;
  ftp_conn *ftpc;
  connectdata *conn_local;
  
  local_24 = CURLE_OK;
  do {
    if ((conn->proto).ftpc.state == FTP_STOP) {
      return local_24;
    }
    local_24 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true);
  } while (local_24 == CURLE_OK);
  return local_24;
}

Assistant:

static CURLcode ftp_block_statemach(struct connectdata *conn)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  CURLcode result = CURLE_OK;

  while(ftpc->state != FTP_STOP) {
    result = Curl_pp_statemach(pp, TRUE);
    if(result)
      break;
  }

  return result;
}